

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
viennamath::expression_not_evaluable_exception::expression_not_evaluable_exception
          (expression_not_evaluable_exception *this,string *str)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__expression_not_evaluable_exception_00116738;
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_,pcVar1,pcVar1 + str->_M_string_length);
  return;
}

Assistant:

expression_not_evaluable_exception(std::string const & str) : message_(str) {}